

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O3

uint16_t __thiscall level_tools::get_terrain_texture(level_tools *this)

{
  pointer pbVar1;
  int iVar2;
  uint16_t uVar3;
  pointer pbVar4;
  
  pbVar4 = (this->m_textures->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_textures->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    uVar3 = 0;
    do {
      iVar2 = std::__cxx11::string::compare((ulong)pbVar4,0,(char *)0x8);
      if (iVar2 == 0) {
        return uVar3;
      }
      pbVar4 = pbVar4 + 1;
      uVar3 = uVar3 + 1;
    } while (pbVar4 != pbVar1);
  }
  return 0xffff;
}

Assistant:

uint16_t level_tools::get_terrain_texture() const
{
	for (std::vector<std::string>::const_iterator it0 = m_textures->begin(), it = it0,
			end = m_textures->end(); it != end; ++it) {
		if (it->compare(0, 8, "terrain\\") == 0)
			return uint16_t((it - it0) & UINT16_MAX);
	}
	return UINT16_MAX;
}